

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppMainMenuBar(void)

{
  bool bVar1;
  
  bVar1 = ImGui::BeginMainMenuBar();
  if (bVar1) {
    bVar1 = ImGui::BeginMenu("File",true);
    if (bVar1) {
      ShowExampleMenuFile();
      ImGui::EndMenu();
    }
    bVar1 = ImGui::BeginMenu("Edit",true);
    if (bVar1) {
      ImGui::MenuItem("Undo","CTRL+Z",false,true);
      ImGui::MenuItem("Redo","CTRL+Y",false,false);
      ImGui::Separator();
      ImGui::MenuItem("Cut","CTRL+X",false,true);
      ImGui::MenuItem("Copy","CTRL+C",false,true);
      ImGui::MenuItem("Paste","CTRL+V",false,true);
      ImGui::EndMenu();
    }
    ImGui::EndMainMenuBar();
  }
  return;
}

Assistant:

static void ShowExampleAppMainMenuBar()
{
    if (ImGui::BeginMainMenuBar())
    {
        if (ImGui::BeginMenu("File"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Edit"))
        {
            if (ImGui::MenuItem("Undo", "CTRL+Z")) {}
            if (ImGui::MenuItem("Redo", "CTRL+Y", false, false)) {}  // Disabled item
            ImGui::Separator();
            if (ImGui::MenuItem("Cut", "CTRL+X")) {}
            if (ImGui::MenuItem("Copy", "CTRL+C")) {}
            if (ImGui::MenuItem("Paste", "CTRL+V")) {}
            ImGui::EndMenu();
        }
        ImGui::EndMainMenuBar();
    }
}